

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfilerBuffer.cpp
# Opt level: O1

void __thiscall
helics::ProfilerBuffer::setOutputFile(ProfilerBuffer *this,string *fileName,bool append)

{
  char *pcVar1;
  int *piVar2;
  error_code *peVar3;
  ofstream file;
  long local_218;
  filebuf local_210 [24];
  byte abStack_1f8 [216];
  ios_base local_120 [264];
  
  if (fileName->_M_string_length == 0) {
    (this->mFileName)._M_string_length = 0;
    *(this->mFileName)._M_dataplus._M_p = '\0';
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&this->mFileName,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fileName);
    if (!append) {
      std::ofstream::ofstream((string *)&local_218);
      std::ofstream::open((string *)&local_218,(_Ios_Openmode)&this->mFileName);
      if ((abStack_1f8[*(long *)(local_218 + -0x18)] & 5) != 0) {
        pcVar1 = (char *)__cxa_allocate_exception(0x20);
        piVar2 = __errno_location();
        peVar3 = (error_code *)strerror(*piVar2);
        std::iostream_category();
        std::ios_base::failure[abi:cxx11]::failure(pcVar1,peVar3);
        __cxa_throw(pcVar1,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      local_218 = _VTT;
      *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = _pthread_mutex_unlock;
      std::filebuf::~filebuf(local_210);
      std::ios_base::~ios_base(local_120);
    }
  }
  return;
}

Assistant:

void ProfilerBuffer::setOutputFile(std::string fileName, bool append)
{
    if (fileName.empty()) {
        mFileName.clear();
        return;
    }
    mFileName = std::move(fileName);
    if (append) {
        return;
    }

    std::ofstream file;
    // can't enable exception now because of gcc bug that raises ios_base::failure with useless
    // message file.exceptions(file.exceptions() | std::ios::failbit);
    file.open(mFileName, std::ios::out | std::ios::trunc);
    if (file.fail()) {
        throw std::ios_base::failure(std::strerror(errno));
    }
}